

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void reset_game(tgestate_t *state)

{
  int iVar1;
  
  iVar1 = 0;
  do {
    item_discovered(state,(item_t)iVar1);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0x10);
  (state->messages).queue_pointer = (state->messages).queue + 2;
  reset_map_and_characters(state);
  state->vischars[0].flags = '\0';
  state->score_digits[0] = '\0';
  state->score_digits[1] = '\0';
  state->score_digits[2] = '\0';
  state->score_digits[3] = '\0';
  state->score_digits[4] = '\0';
  state->hero_in_breakfast = '\0';
  state->red_flag = '\0';
  state->automatic_player_counter = '\0';
  state->in_solitary = '\0';
  state->morale_exhausted = '\0';
  state->morale = 'p';
  plot_score(state);
  state->items_held[0] = 0xff;
  state->items_held[1] = 0xff;
  draw_all_items(state);
  state->vischars[0].mi.sprite = sprites + 2;
  state->room_index = '\x02';
  hero_sleeps(state);
  state->bribed_character = 0xff;
  state->movable_items[0].mappos.u = 0x3e;
  state->movable_items[0].mappos.v = 0x23;
  state->movable_items[0].mappos.w = 0x10;
  state->movable_items[1].mappos.u = 0x37;
  state->movable_items[1].mappos.v = 0x36;
  state->movable_items[1].mappos.w = 0xe;
  state->movable_items[2].mappos.u = 0x3e;
  state->movable_items[2].mappos.v = 0x23;
  state->movable_items[2].mappos.w = 0x10;
  enter_room(state);
}

Assistant:

void reset_game(tgestate_t *state)
{
  int    iters; /* was B */
  item_t item;  /* was C */

  assert(state != NULL);

  /* Cause discovery of all items. */
  iters = item__LIMIT;
  item = 0;
  do
    item_discovered(state, item++);
  while (--iters);

  /* Reset message queue. */
  state->messages.queue_pointer = &state->messages.queue[2];
  reset_map_and_characters(state);
  state->vischars[0].flags = 0;

  /* Reset score. */
  memset(&state->score_digits[0], 0, 5);

  state->hero_in_breakfast        = 0;
  state->red_flag                 = 0;
  state->automatic_player_counter = 0;
  state->in_solitary              = 0;
  state->morale_exhausted         = 0;

  /* Reset morale. */
  state->morale = morale_MAX;
  plot_score(state);

  /* Reset and redraw items. */
  state->items_held[0] = item_NONE;
  state->items_held[1] = item_NONE;
  draw_all_items(state);

  /* Reset the hero's sprite. */
  state->vischars[0].mi.sprite = &sprites[sprite_PRISONER_FACING_AWAY_1];

  /* Put the hero to bed. */
  state->room_index = room_2_HUT2LEFT;
  hero_sleeps(state);

  /* BUG FIX: Reset bribed character index. */
  state->bribed_character = character_NONE;

  /* BUG FIX: Reset position of stoves and crate. */
  state->movable_items[0].mappos.u = 62;
  state->movable_items[0].mappos.v = 35;
  state->movable_items[0].mappos.w = 16;
  state->movable_items[1].mappos.u = 55;
  state->movable_items[1].mappos.v = 54;
  state->movable_items[1].mappos.w = 14;
  state->movable_items[2].mappos.u = 62;
  state->movable_items[2].mappos.v = 35;
  state->movable_items[2].mappos.w = 16;

  enter_room(state); // returns by goto main_loop
  NEVER_RETURNS;
}